

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteString.cpp
# Opt level: O1

ByteString * __thiscall ByteString::operator^=(ByteString *this,ByteString *rhs)

{
  byte *pbVar1;
  ulong uVar2;
  ulong uVar3;
  uchar *puVar4;
  
  uVar3 = (long)(this->byteString).
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->byteString).
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  uVar2 = (long)(rhs->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(rhs->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (uVar3 <= uVar2) {
    uVar2 = uVar3;
  }
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      puVar4 = (rhs->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((rhs->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish == puVar4) {
        puVar4 = sentinel;
      }
      pbVar1 = (this->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar3;
      *pbVar1 = *pbVar1 ^ puVar4[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  return this;
}

Assistant:

ByteString& ByteString::operator^=(const ByteString& rhs)
{
	size_t xorLen = std::min(this->size(), rhs.size());

	for (size_t i = 0; i < xorLen; i++)
	{
		byteString[i] ^= rhs.const_byte_str()[i];
	}

	return *this;
}